

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

ostream * anon_unknown.dwarf_11e01b::operator<<(ostream *out,IDManifest *mfst)

{
  ulong uVar1;
  bool bVar2;
  IdLifetime IVar3;
  ulong uVar4;
  reference pbVar5;
  ostream *poVar6;
  string *psVar7;
  uint64_t uVar8;
  reference pbVar9;
  ulong in_RSI;
  ostream *in_RDI;
  const_iterator c_1;
  ConstIterator q;
  const_iterator c;
  const_iterator s;
  bool first;
  ChannelGroupManifest *m;
  size_t i;
  ConstIterator *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined8 local_58;
  undefined8 local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  _Self local_38;
  _Self local_30;
  byte local_21;
  ChannelGroupManifest *local_20;
  ulong local_18;
  ulong local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; uVar1 = local_18, uVar4 = Imf_3_4::IDManifest::size(), uVar1 < uVar4;
      local_18 = local_18 + 1) {
    local_20 = (ChannelGroupManifest *)Imf_3_4::IDManifest::operator[](local_10);
    local_21 = 1;
    std::operator<<(local_8,"chans:");
    Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff48);
    while( true ) {
      Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      local_38._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff48);
      bVar2 = std::operator!=(&local_30,&local_38);
      if (!bVar2) break;
      if ((local_21 & 1) == 0) {
        std::operator<<(local_8,',');
      }
      else {
        local_21 = 0;
      }
      poVar6 = local_8;
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x1a5c1c);
      std::operator<<(poVar6,(string *)pbVar5);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff50);
    }
    poVar6 = std::operator<<(local_8,"\nhash:");
    psVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getHashScheme_abi_cxx11_(local_20);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(local_8,"encoding:");
    psVar7 = Imf_3_4::IDManifest::ChannelGroupManifest::getEncodingScheme_abi_cxx11_(local_20);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    IVar3 = Imf_3_4::IDManifest::ChannelGroupManifest::getLifetime(local_20);
    if (IVar3 == LIFETIME_FRAME) {
      std::operator<<(local_8,"lifetime:frame\n");
    }
    else if (IVar3 == LIFETIME_SHOT) {
      std::operator<<(local_8,"lifetime:shot\n");
    }
    else if (IVar3 == LIFETIME_STABLE) {
      std::operator<<(local_8,"lifetime:stable\n");
    }
    std::operator<<(local_8,' ');
    Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
    local_40._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff48);
    while( true ) {
      Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff48);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar2) break;
      poVar6 = std::operator<<(local_8,';');
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
      std::operator<<(poVar6,(string *)pbVar9);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_40);
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
    local_50 = Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    while( true ) {
      local_58 = Imf_3_4::IDManifest::ChannelGroupManifest::end();
      bVar2 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffff50,
                                  in_stack_ffffffffffffff48);
      poVar6 = local_8;
      if (!bVar2) break;
      uVar8 = Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::id
                        ((ConstIterator *)0x1a5e2d);
      std::ostream::operator<<(poVar6,uVar8);
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                ((ConstIterator *)0x1a5e44);
      local_60._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffff48);
      while( true ) {
        Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::text_abi_cxx11_
                  ((ConstIterator *)0x1a5e5b);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff48);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar2) break;
        in_stack_ffffffffffffff50 = std::operator<<(local_8,';');
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_60);
        std::operator<<(in_stack_ffffffffffffff50,(string *)pbVar9);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_60);
      }
      std::operator<<(local_8,'\n');
      Imf_3_4::IDManifest::ChannelGroupManifest::ConstIterator::operator++
                ((ConstIterator *)in_stack_ffffffffffffff50);
    }
  }
  return local_8;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const IDManifest& mfst)
{
    for (size_t i = 0; i < mfst.size (); ++i)
    {

        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        out << "chans:";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { out << ','; }
            else { first = false; }

            out << *s;
        }

        out << "\nhash:" << m.getHashScheme () << endl;
        out << "encoding:" << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME: out << "lifetime:frame\n"; break;
            case IDManifest::LIFETIME_SHOT: out << "lifetime:shot\n"; break;
            case IDManifest::LIFETIME_STABLE: out << "lifetime:stable\n"; break;
        }
        out << ' ';
        for (vector<string>::const_iterator c = m.getComponents ().begin ();
             c != m.getComponents ().end ();
             ++c)
        {
            out << ';' << *c;
        }
        out << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            out << q.id ();
            for (vector<string>::const_iterator c = q.text ().begin ();
                 c != q.text ().end ();
                 ++c)
            {
                out << ';' << *c;
            }
            out << '\n';
        }
    }
    return out;
}